

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compare_tests.c
# Opt level: O0

void cjson_compare_should_compare_raw(void)

{
  cJSON_bool cVar1;
  cJSON *a;
  cJSON *b;
  cJSON *raw2;
  cJSON *raw1;
  
  a = cJSON_Parse("\"[true, false]\"");
  if (a == (cJSON *)0x0) {
    UnityFail(" Expected Non-NULL",0x7f);
  }
  b = cJSON_Parse("\"[true, false]\"");
  if (b == (cJSON *)0x0) {
    UnityFail(" Expected Non-NULL",0x81);
  }
  a->type = 0x80;
  b->type = 0x80;
  cVar1 = cJSON_Compare(a,b,1);
  if (cVar1 == 0) {
    UnityFail(" Expected TRUE Was FALSE",0x86);
  }
  cVar1 = cJSON_Compare(a,b,0);
  if (cVar1 == 0) {
    UnityFail(" Expected TRUE Was FALSE",0x87);
  }
  cJSON_Delete(a);
  cJSON_Delete(b);
  return;
}

Assistant:

static void cjson_compare_should_compare_raw(void)
{
    cJSON *raw1 = NULL;
    cJSON *raw2 = NULL;

    raw1 = cJSON_Parse("\"[true, false]\"");
    TEST_ASSERT_NOT_NULL(raw1);
    raw2 = cJSON_Parse("\"[true, false]\"");
    TEST_ASSERT_NOT_NULL(raw2);

    raw1->type = cJSON_Raw;
    raw2->type = cJSON_Raw;

    TEST_ASSERT_TRUE(cJSON_Compare(raw1, raw2, true));
    TEST_ASSERT_TRUE(cJSON_Compare(raw1, raw2, false));

    cJSON_Delete(raw1);
    cJSON_Delete(raw2);
}